

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autowah.cpp
# Opt level: O0

EffectProps * __thiscall
anon_unknown.dwarf_fb101::AutowahStateFactory::getDefaultProps(AutowahStateFactory *this)

{
  EffectProps *in_RDI;
  EffectProps *props;
  
  memset(in_RDI,0,0x6c);
  (in_RDI->Chorus).Waveform = 0x3d75c28f;
  (in_RDI->Chorus).Phase = 0x3d75c28f;
  (in_RDI->Fshifter).RightDirection = 0x447a0000;
  (in_RDI->Vmorpher).PhonemeACoarseTuning = 0x4133851f;
  return in_RDI;
}

Assistant:

EffectProps AutowahStateFactory::getDefaultProps() const noexcept
{
    EffectProps props{};
    props.Autowah.AttackTime = AL_AUTOWAH_DEFAULT_ATTACK_TIME;
    props.Autowah.ReleaseTime = AL_AUTOWAH_DEFAULT_RELEASE_TIME;
    props.Autowah.Resonance = AL_AUTOWAH_DEFAULT_RESONANCE;
    props.Autowah.PeakGain = AL_AUTOWAH_DEFAULT_PEAK_GAIN;
    return props;
}